

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O2

void __thiscall CSemaphore::post(CSemaphore *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&this->mutex);
  this->value = this->value + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::condition_variable::notify_one();
    return;
  }
  __stack_chk_fail();
}

Assistant:

void post() noexcept
    {
        {
            std::lock_guard<std::mutex> lock(mutex);
            value++;
        }
        condition.notify_one();
    }